

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O3

void __thiscall asio::detail::thread_info_base::capture_current_exception(thread_info_base *this)

{
  exception_ptr eVar1;
  void *pvVar2;
  void *__tmp;
  void *local_48;
  exception_ptr local_40;
  void *local_38;
  undefined **local_30;
  void *local_28;
  
  if (this->has_pending_exception_ == 1) {
    this->has_pending_exception_ = 2;
    local_40._M_exception_object = (this->pending_exception_)._M_exception_object;
    if (local_40._M_exception_object == (void *)0x0) {
      local_28 = (void *)0x0;
    }
    else {
      std::__exception_ptr::exception_ptr::_M_addref();
      local_28 = local_40._M_exception_object;
    }
    local_30 = &PTR__multiple_exceptions_0011f750;
    local_40._M_exception_object = (void *)0x0;
    std::make_exception_ptr<asio::multiple_exceptions>((multiple_exceptions *)&local_48);
    pvVar2 = local_48;
    local_48 = (void *)0x0;
    local_38 = (this->pending_exception_)._M_exception_object;
    (this->pending_exception_)._M_exception_object = pvVar2;
    if ((local_38 != (void *)0x0) &&
       (std::__exception_ptr::exception_ptr::_M_release(), local_48 != (void *)0x0)) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    local_30 = &PTR__multiple_exceptions_0011f750;
    if (local_28 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    std::exception::~exception((exception *)&local_30);
    eVar1._M_exception_object = local_40._M_exception_object;
  }
  else {
    if (this->has_pending_exception_ != 0) {
      return;
    }
    this->has_pending_exception_ = 1;
    std::current_exception();
    pvVar2 = local_48;
    local_48 = (void *)0x0;
    local_38 = (this->pending_exception_)._M_exception_object;
    (this->pending_exception_)._M_exception_object = pvVar2;
    if (local_38 == (void *)0x0) {
      return;
    }
    std::__exception_ptr::exception_ptr::_M_release();
    eVar1._M_exception_object = local_48;
  }
  if (eVar1._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

void capture_current_exception()
  {
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    switch (has_pending_exception_)
    {
    case 0:
      has_pending_exception_ = 1;
      pending_exception_ = std::current_exception();
      break;
    case 1:
      has_pending_exception_ = 2;
      pending_exception_ =
        std::make_exception_ptr<multiple_exceptions>(
            multiple_exceptions(pending_exception_));
      break;
    default:
      break;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       // && !defined(ASIO_NO_EXCEPTIONS)
  }